

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *__s2;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  addrinfo *ai;
  addrinfo hints;
  addrinfo *local_70;
  addrinfo local_68;
  
  if (argc < 2) {
    __s2 = (char *)0x0;
  }
  else {
    uVar4 = 1;
    pcVar5 = (char *)0x0;
    do {
      __s2 = argv[uVar4];
      iVar1 = strcmp("--version",__s2);
      if (iVar1 == 0) {
        curl_mprintf("resolve IPv4%s\n","/IPv6");
        return 0;
      }
      iVar1 = strcmp("--ipv6",__s2);
      pcVar3 = "IPv6";
      if (iVar1 == 0) {
LAB_00104f9f:
        use_ipv6 = iVar1 == 0;
        __s2 = pcVar5;
        ipv_inuse = pcVar3;
      }
      else {
        iVar2 = strcmp("--ipv4",__s2);
        pcVar3 = "IPv4";
        if (iVar2 == 0) goto LAB_00104f9f;
      }
      uVar4 = uVar4 + 1;
      pcVar5 = __s2;
    } while ((uint)argc != uVar4);
  }
  if (__s2 == (char *)0x0) {
    puts("Usage: resolve [option] <host>\n --version\n --ipv4\n --ipv6");
    return 1;
  }
  if (use_ipv6 == 1) {
    iVar1 = socket(10,2,0);
    if (iVar1 == -1) {
      bVar6 = true;
      goto LAB_0010504f;
    }
    close(iVar1);
  }
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  local_68.ai_family = (uint)use_ipv6 * 8 + 2;
  local_68.ai_flags = 2;
  iVar1 = getaddrinfo(__s2,"80",&local_68,&local_70);
  if (iVar1 == 0) {
    freeaddrinfo(local_70);
  }
  bVar6 = iVar1 != 0;
LAB_0010504f:
  if (bVar6 != false) {
    curl_mprintf("Resolving %s \'%s\' didn\'t work\n",ipv_inuse,__s2);
  }
  return (uint)bVar6;
}

Assistant:

int main(int argc, char *argv[])
{
  int arg = 1;
  const char *host = NULL;
  int rc = 0;

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("resolve IPv4%s\n",
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--ipv6", argv[arg])) {
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
      arg++;
    }
    else if(!strcmp("--ipv4", argv[arg])) {
      /* for completeness, we support this option as well */
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
      arg++;
    }
    else {
      host = argv[arg++];
    }
  }
  if(!host) {
    puts("Usage: resolve [option] <host>\n"
         " --version\n"
         " --ipv4"
#ifdef ENABLE_IPV6
         "\n --ipv6"
#endif
         );
    return 1;
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);
#endif

#ifdef ENABLE_IPV6
  if(use_ipv6) {
    /* Check that the system has IPv6 enabled before checking the resolver */
    curl_socket_t s = socket(PF_INET6, SOCK_DGRAM, 0);
    if(s == CURL_SOCKET_BAD)
      /* an IPv6 address was requested and we can't get/use one */
      rc = -1;
    else {
      sclose(s);
    }
  }

  if(rc == 0) {
    /* getaddrinfo() resolve */
    struct addrinfo *ai;
    struct addrinfo hints;

    memset(&hints, 0, sizeof(hints));
    hints.ai_family = use_ipv6 ? PF_INET6 : PF_INET;
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_flags = AI_CANONNAME;
    /* Use parenthesis around functions to stop them from being replaced by
       the macro in memdebug.h */
    rc = (getaddrinfo)(host, "80", &hints, &ai);
    if(rc == 0)
      (freeaddrinfo)(ai);
  }
#else
  if(use_ipv6) {
    puts("IPv6 support has been disabled in this program");
    return 1;
  }
  else {
    /* gethostbyname() resolve */
    struct hostent *he;

    he = gethostbyname(host);

    rc = !he;
  }
#endif

  if(rc)
    printf("Resolving %s '%s' didn't work\n", ipv_inuse, host);

  return !!rc;
}